

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O0

bool __thiscall HtmlModelSerialiser::loadModel(HtmlModelSerialiser *this,QString *source)

{
  QXmlStreamReader local_30 [8];
  QXmlStreamReader reader;
  HtmlModelSerialiserPrivate *d;
  QString *source_local;
  HtmlModelSerialiser *this_local;
  
  if (source == (QString *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    _reader = d_func(this);
    if ((_reader->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
        m_model == (QAbstractItemModel *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      QXmlStreamReader::QXmlStreamReader(local_30,(QString *)source);
      this_local._7_1_ = HtmlModelSerialiserPrivate::readHtml(_reader,local_30);
      QXmlStreamReader::~QXmlStreamReader(local_30);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HtmlModelSerialiser::loadModel(QString *source)
{
    if (!source)
        return false;
    Q_D(HtmlModelSerialiser);

    if (!d->m_model)
        return false;
    QXmlStreamReader reader(*source);
    return d->readHtml(reader);
}